

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O0

Config * __thiscall QPDFJob::Config::replaceInput(Config *this)

{
  bool bVar1;
  element_type *peVar2;
  allocator<char> local_31;
  string local_30;
  Config *local_10;
  Config *this_local;
  
  local_10 = this;
  peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this->o);
  bVar1 = std::operator==(&peVar2->outfilename,(nullptr_t)0x0);
  if ((bVar1) &&
     (peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this->o), (peVar2->replace_input & 1U) == 0)) {
    peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this->o);
    peVar2->replace_input = true;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,
               "replace-input can\'t be used since output file has already been given",&local_31);
    usage(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::allocator<char>::~allocator(&local_31);
  }
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::replaceInput()
{
    if ((o.m->outfilename == nullptr) && (!o.m->replace_input)) {
        o.m->replace_input = true;
    } else {
        usage("replace-input can't be used since output file has already been given");
    }
    return this;
}